

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cc
# Opt level: O0

void __thiscall Filter::reset(Filter *this)

{
  Filter *in_RDI;
  
  in_RDI->fc = 0;
  in_RDI->res = 0;
  in_RDI->filt = 0;
  in_RDI->voice3off = 0;
  in_RDI->hp_bp_lp = 0;
  in_RDI->vol = 0;
  in_RDI->Vhp = 0;
  in_RDI->Vbp = 0;
  in_RDI->Vlp = 0;
  in_RDI->Vnf = 0;
  set_w0(in_RDI);
  set_Q(in_RDI);
  return;
}

Assistant:

void Filter::reset()
{
  fc = 0;

  res = 0;

  filt = 0;

  voice3off = 0;

  hp_bp_lp = 0;

  vol = 0;

  // State of filter.
  Vhp = 0;
  Vbp = 0;
  Vlp = 0;
  Vnf = 0;

  set_w0();
  set_Q();
}